

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_mod_u_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ushort uVar1;
  ushort uVar2;
  
  uVar2 = *(ushort *)((env->active_fpu).fpr + ws);
  uVar1 = *(ushort *)((env->active_fpu).fpr + wt);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(ushort *)((env->active_fpu).fpr + wd) = uVar2;
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 2);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 2);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 2) = uVar2;
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = uVar2;
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 6);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 6);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 6) = uVar2;
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar2;
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 10);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 10);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 10) = uVar2;
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = uVar2;
  uVar2 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xe);
  uVar1 = *(ushort *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xe);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(ushort *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xe) = uVar2;
  return;
}

Assistant:

void helper_msa_mod_u_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_mod_u_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_mod_u_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_mod_u_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_mod_u_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_mod_u_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_mod_u_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_mod_u_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_mod_u_df(DF_HALF, pws->h[7],  pwt->h[7]);
}